

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::processFinished(llbuild::basic::
ProcessContext*,llbuild::basic::ProcessHandle,llbuild::basic::ProcessResult_const__
          (void *this,ProcessContext *ctx,ProcessHandle handle,ProcessResult *result)

{
  undefined8 *puVar1;
  
  puVar1 = *(undefined8 **)((long)this + 8);
  if (puVar1 != (undefined8 *)0x0) {
    if (3 < (uint)result->status) {
      __assert_fail("0 && \"unknown command result\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0xab,
                    "llb_buildsystem_command_result_t (anonymous namespace)::get_command_result(ProcessStatus)"
                   );
    }
    (*(code *)puVar1[4])(*puVar1);
  }
  return;
}

Assistant:

virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      if (delegate != NULL) {
        llb_buildsystem_command_extended_result_t res;
        res.result = get_command_result(result.status);
        res.exit_status = result.exitCode;
        res.pid = result.pid;
        res.utime = result.utime;
        res.stime = result.stime;
        res.maxrss = result.maxrss;
        delegate->process_finished(delegate->context, &res);
      }
    }